

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Add_DoubleHelper
              (Var addLeft,double dblRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var pvVar2;
  double dVar3;
  
  bVar1 = TaggedInt::Is(addLeft);
  if (bVar1) {
    dVar3 = (double)(int)addLeft;
  }
  else {
    if ((ulong)addLeft >> 0x32 == 0) {
      pvVar2 = JavascriptNumber::ToVarMaybeInPlace(dblRight,scriptContext,result);
      pvVar2 = Add_Full(addLeft,pvVar2,scriptContext);
      return pvVar2;
    }
    dVar3 = JavascriptNumber::GetValue(addLeft);
  }
  pvVar2 = JavascriptNumber::ToVarMaybeInPlace(dVar3 + dblRight,scriptContext,result);
  return pvVar2;
}

Assistant:

Var inline JavascriptMath::Add_DoubleHelper(Var addLeft, double dblRight, ScriptContext* scriptContext, JavascriptNumber*result)
        {
            if (TaggedInt::Is(addLeft))
            {
                double sum =  TaggedInt::ToDouble(addLeft) + dblRight;

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(addLeft))
            {
                double sum = JavascriptNumber::GetValue(addLeft) + dblRight;

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else
            {
                Var aRight = JavascriptNumber::ToVarMaybeInPlace(dblRight, scriptContext, result);

                return Add_Full(addLeft, aRight, scriptContext);
            }
        }